

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O3

int __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
::close(mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
        *this,int __fd)

{
  size_t sVar1;
  size_t sVar2;
  undefined8 *puVar3;
  select_case_t *psVar4;
  int iVar5;
  select_case_t *psVar6;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->m_lock);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  if (this->m_status == closed) goto LAB_0021221b;
  this->m_status = closed;
  sVar1 = (this->m_queue).m_max_size;
  sVar2 = (this->m_queue).m_size;
  if (__fd == 0) {
    if (sVar2 != 0) {
      do {
        details::
        ensure_queue_not_empty<so_5::mchain_props::details::limited_preallocated_demand_queue&>
                  (&this->m_queue);
        details::limited_preallocated_demand_queue::pop_front(&this->m_queue);
      } while ((this->m_queue).m_size != 0);
    }
LAB_002121bc:
    psVar6 = this->m_select_tail;
    if (psVar6 != (select_case_t *)0x0) {
      this->m_select_tail = (select_case_t *)0x0;
      do {
        puVar3 = *(undefined8 **)(psVar6 + 0x10);
        psVar4 = *(select_case_t **)(psVar6 + 0x18);
        *(undefined8 *)(psVar6 + 0x10) = 0;
        *(undefined8 *)(psVar6 + 0x18) = 0;
        (**(code **)*puVar3)();
        psVar6 = psVar4;
      } while (psVar4 != (select_case_t *)0x0);
    }
  }
  else if (sVar2 == 0) goto LAB_002121bc;
  if (this->m_threads_to_wakeup != 0) {
    std::condition_variable::notify_all();
  }
  if (sVar1 == sVar2) {
    std::condition_variable::notify_all();
  }
LAB_0021221b:
  iVar5 = pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
  return iVar5;
}

Assistant:

virtual void
		close( close_mode_t mode ) override
			{
				std::lock_guard< std::mutex > lock{ m_lock };

				if( details::status::closed == m_status )
					return;

				m_status = details::status::closed;

				const bool was_full = m_queue.is_full();

				if( close_mode_t::drop_content == mode )
					{
						while( !m_queue.is_empty() )
							{
								this->trace_demand_drop_on_close(
										*this, m_queue.front() );
								m_queue.pop_front();
							}
					}

				// If queue is empty now and there is any multi chain select
				// than select_tail must be handled.
				if( m_queue.is_empty() )
					notify_multi_chain_select_ops();

				if( m_threads_to_wakeup )
					// Someone is waiting on empty chain for new messages.
					// It must be informed that no new messages will be here.
					m_underflow_cond.notify_all();

				if( was_full )
					// Someone can wait on full chain for free place for new message.
					// It must be informed that the chain is closed.
					m_overflow_cond.notify_all();
			}